

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

bool __thiscall leveldb::MemTable::Get(MemTable *this,LookupKey *key,string *value,Status *s)

{
  bool bVar1;
  int iVar2;
  char **ppcVar3;
  Comparator *pCVar4;
  char *pcVar5;
  Slice local_d0;
  Slice local_c0;
  Status local_b0;
  undefined1 local_a8 [8];
  Slice v;
  uint64_t tag;
  Slice local_80;
  char *local_70;
  char *key_ptr;
  char *pcStack_60;
  uint32_t key_length;
  char *entry;
  undefined1 local_50 [8];
  Iterator iter;
  Slice memkey;
  Status *s_local;
  string *value_local;
  LookupKey *key_local;
  MemTable *this_local;
  
  join_0x00000010_0x00000000_ = LookupKey::memtable_key(key);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Iterator
            ((Iterator *)local_50,&this->table_);
  entry = Slice::data((Slice *)&iter.node_);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Seek
            ((Iterator *)local_50,&entry);
  bVar1 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Valid
                    ((Iterator *)local_50);
  if (bVar1) {
    ppcVar3 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::key
                        ((Iterator *)local_50);
    pcStack_60 = *ppcVar3;
    local_70 = GetVarint32Ptr(pcStack_60,pcStack_60 + 5,(uint32_t *)((long)&key_ptr + 4));
    pCVar4 = InternalKeyComparator::user_comparator((InternalKeyComparator *)this);
    Slice::Slice(&local_80,local_70,(ulong)(key_ptr._4_4_ - 8));
    _tag = LookupKey::user_key(key);
    iVar2 = (*pCVar4->_vptr_Comparator[2])(pCVar4,&local_80,&tag);
    if (iVar2 == 0) {
      v.size_ = DecodeFixed64(local_70 + ((ulong)key_ptr._4_4_ - 8));
      if ((char)v.size_ == '\0') {
        Slice::Slice(&local_c0);
        Slice::Slice(&local_d0);
        Status::NotFound(&local_b0,&local_c0,&local_d0);
        Status::operator=(s,&local_b0);
        Status::~Status(&local_b0);
        return true;
      }
      if ((char)v.size_ == '\x01') {
        _local_a8 = GetLengthPrefixedSlice(local_70 + key_ptr._4_4_);
        pcVar5 = Slice::data((Slice *)local_a8);
        Slice::size((Slice *)local_a8);
        std::__cxx11::string::assign((char *)value,(ulong)pcVar5);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool MemTable::Get(const LookupKey &key, std::string *value, Status *s) {
        Slice memkey = key.memtable_key();
        Table::Iterator iter(&table_);
        iter.Seek(memkey.data());
        if (iter.Valid()) {
            // entry format is:
            //    klength  varint32
            //    userkey  char[klength]
            //    tag      uint64
            //    vlength  varint32
            //    value    char[vlength]
            // Check that it belongs to same user key.  We do not check the
            // sequence number since the Seek() call above should have skipped
            // all entries with overly large sequence numbers.
            const char *entry = iter.key();
            uint32_t key_length;
            const char *key_ptr = GetVarint32Ptr(entry, entry + 5, &key_length);
            if (comparator_.comparator.user_comparator()->Compare(
                    Slice(key_ptr, key_length - 8),
                    key.user_key()) == 0) {
                // Correct user key
                const uint64_t tag = DecodeFixed64(key_ptr + key_length - 8);
                switch (static_cast<ValueType>(tag & 0xff)) {
                    case kTypeValue: {
                        Slice v = GetLengthPrefixedSlice(key_ptr + key_length);
                        value->assign(v.data(), v.size());
                        return true;
                    }
                    case kTypeDeletion:
                        *s = Status::NotFound(Slice());
                        return true;
                }
            }
        }
        return false;
    }